

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

unsigned_long
rcg::anon_unknown_5::getBufferValue<unsigned_long>
          (shared_ptr<const_rcg::GenTLWrapper> *gentl,void *stream,void *buffer,BUFFER_INFO_CMD cmd)

{
  GC_ERROR GVar1;
  element_type *peVar2;
  BUFFER_INFO_CMD in_ECX;
  BUFFER_HANDLE in_RDX;
  DS_HANDLE in_RSI;
  size_t size;
  INFO_DATATYPE type;
  unsigned_long ret;
  size_t local_38;
  INFO_DATATYPE local_2c;
  unsigned_long local_28;
  BUFFER_INFO_CMD local_1c;
  BUFFER_HANDLE local_18;
  DS_HANDLE local_10;
  
  local_28 = 0;
  local_38 = 8;
  if ((in_RSI != (DS_HANDLE)0x0) && (in_RDX != (BUFFER_HANDLE)0x0)) {
    local_1c = in_ECX;
    local_18 = in_RDX;
    local_10 = in_RSI;
    peVar2 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x125e72);
    GVar1 = (*peVar2->DSGetBufferInfo)(local_10,local_18,local_1c,&local_2c,&local_28,&local_38);
    if (GVar1 != 0) {
      local_28 = 0;
    }
  }
  return local_28;
}

Assistant:

inline T getBufferValue(const std::shared_ptr<const GenTLWrapper> &gentl,
                                          void *stream, void *buffer, GenTL::BUFFER_INFO_CMD cmd)
{
  T ret=0;

  GenTL::INFO_DATATYPE type;
  size_t size=sizeof(T);

  if (stream != 0 && buffer != 0)
  {
    if (gentl->DSGetBufferInfo(stream, buffer, cmd, &type, &ret, &size) != GenTL::GC_ERR_SUCCESS)
    {
      ret=0;
    }
  }

  return ret;
}